

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.c
# Opt level: O1

char * stripbrackets(char *string)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  
  if (string == (char *)0x0) {
    string = (char *)0x0;
  }
  else if ((*string == '[') && (sVar3 = strlen(string), string[sVar3 - 1] == ']')) {
    cVar1 = string[1];
    pcVar2 = string;
    while (cVar1 != ']') {
      *pcVar2 = cVar1;
      cVar1 = pcVar2[2];
      pcVar2 = pcVar2 + 1;
    }
    *pcVar2 = '\0';
  }
  return string;
}

Assistant:

char *stripbrackets(char *string) {
  if (!string)
    return NULL;
  char *ptr = string, *buffer = string;
  size_t length = strlen(string) - 1;
  if (*string == '[' && string[length] == ']') {
    while (*(++string) != ']') { *buffer++ = *string; }
    *buffer = 0;
  }
  return ptr;
}